

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall FIX::Acceptor::initialize(Acceptor *this)

{
  bool bVar1;
  size_type sVar2;
  ConfigError *pCVar3;
  reference pSVar4;
  Dictionary *pDVar5;
  reference sessionID;
  Session *pSVar6;
  mapped_type *ppSVar7;
  size_type sVar8;
  pair<std::_Rb_tree_const_iterator<FIX::SessionID>,_bool> pVar9;
  allocator<char> local_151;
  string local_150;
  _Base_ptr local_130;
  undefined1 local_128;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  _Self local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8 [8];
  SessionFactory factory;
  allocator<char> local_69;
  string local_68;
  _Rb_tree_const_iterator<FIX::SessionID> local_48;
  iterator i;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  Acceptor *this_local;
  
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)&i,
             &this->m_settings);
  std::_Rb_tree_const_iterator<FIX::SessionID>::_Rb_tree_const_iterator(&local_48);
  sVar2 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::size
                    ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                      *)&i);
  if (sVar2 == 0) {
    factory.m_dictionaries._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
    pCVar3 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"No sessions defined",&local_69);
    ConfigError::ConfigError(pCVar3,&local_68);
    factory.m_dictionaries._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
    __cxa_throw(pCVar3,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  SessionFactory::SessionFactory
            ((SessionFactory *)local_c8,this->m_application,this->m_messageStoreFactory,
             this->m_pLogFactory);
  local_d0 = (_Base_ptr)
             std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
             begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                    *)&i);
  local_48._M_node = local_d0;
  while( true ) {
    local_d8._M_node =
         (_Base_ptr)
         std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                   ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                     *)&i);
    bVar1 = std::operator!=(&local_48,&local_d8);
    if (!bVar1) break;
    pSVar4 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_48);
    pDVar5 = SessionSettings::get(&this->m_settings,pSVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ConnectionType",&local_119);
    Dictionary::getString(&local_f8,pDVar5,&local_118,false);
    bVar1 = std::operator==(&local_f8,"acceptor");
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    if (bVar1) {
      pSVar4 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_48);
      pVar9 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
              insert(&this->m_sessionIDs,pSVar4);
      local_130 = (_Base_ptr)pVar9.first._M_node;
      local_128 = pVar9.second;
      pSVar4 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_48);
      sessionID = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_48);
      pDVar5 = SessionSettings::get(&this->m_settings,sessionID);
      pSVar6 = SessionFactory::create((SessionFactory *)local_c8,pSVar4,pDVar5);
      pSVar4 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_48);
      ppSVar7 = std::
                map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                ::operator[](&this->m_sessions,pSVar4);
      *ppSVar7 = pSVar6;
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_48);
  }
  sVar8 = std::
          map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
          ::size(&this->m_sessions);
  if (sVar8 != 0) {
    SessionFactory::~SessionFactory((SessionFactory *)local_c8);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)&i
              );
    return;
  }
  pCVar3 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"No sessions defined for acceptor",&local_151);
  ConfigError::ConfigError(pCVar3,&local_150);
  __cxa_throw(pCVar3,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

EXCEPT(ConfigError) {
  std::set<SessionID> sessions = m_settings.getSessions();
  std::set<SessionID>::iterator i;

  if (!sessions.size()) {
    throw ConfigError("No sessions defined");
  }

  SessionFactory factory(m_application, m_messageStoreFactory, m_pLogFactory);

  for (i = sessions.begin(); i != sessions.end(); ++i) {
    if (m_settings.get(*i).getString(CONNECTION_TYPE) == "acceptor") {
      m_sessionIDs.insert(*i);
      m_sessions[*i] = factory.create(*i, m_settings.get(*i));
    }
  }

  if (!m_sessions.size()) {
    throw ConfigError("No sessions defined for acceptor");
  }
}